

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O2

bool __thiscall
msgpack11::
Value<(msgpack11::MsgPack::Type)15,_std::map<msgpack11::MsgPack,_msgpack11::MsgPack,_std::less<msgpack11::MsgPack>,_std::allocator<std::pair<const_msgpack11::MsgPack,_msgpack11::MsgPack>_>_>_>
::less(Value<(msgpack11::MsgPack::Type)15,_std::map<msgpack11::MsgPack,_msgpack11::MsgPack,_std::less<msgpack11::MsgPack>,_std::allocator<std::pair<const_msgpack11::MsgPack,_msgpack11::MsgPack>_>_>_>
       *this,MsgPackValue *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (*other->_vptr_MsgPackValue[3])(other);
  iVar3 = (*other->_vptr_MsgPackValue[3])(other);
  bVar1 = true;
  if (iVar3 < 0x10) {
    if (iVar2 == 0xf) {
      bVar1 = std::operator<(&(this->m_value)._M_t,
                             (_Rb_tree<msgpack11::MsgPack,_std::pair<const_msgpack11::MsgPack,_msgpack11::MsgPack>,_std::_Select1st<std::pair<const_msgpack11::MsgPack,_msgpack11::MsgPack>_>,_std::less<msgpack11::MsgPack>,_std::allocator<std::pair<const_msgpack11::MsgPack,_msgpack11::MsgPack>_>_>
                              *)(other + 1));
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool less(const MsgPackValue * other) const override {
        bool const is_same_type = tag == other->type();
        bool const is_less_type = tag < other->type();
        return is_less_type || (is_same_type && (m_value < static_cast<const Value<tag, T> *>(other)->m_value));
    }